

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string_t duckdb::NumericHelper::FormatSigned<unsigned_short>(unsigned_short value,Vector *vector)

{
  int iVar1;
  idx_t len;
  char *pcVar2;
  string_t result;
  anon_union_16_2_67f50693_for_value local_28;
  
  iVar1 = UnsignedLength<unsigned_short>(value);
  local_28.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector,(Vector *)(long)iVar1,len);
  pcVar2 = local_28.pointer.prefix;
  if (0xc < local_28._0_4_) {
    pcVar2 = local_28._8_8_;
  }
  FormatUnsigned<unsigned_short>(value,pcVar2 + iVar1);
  string_t::Finalize((string_t *)&local_28.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28.pointer;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}